

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::GoniometricLight::PDF_Le(GoniometricLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  Float FVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Point2f local_18;
  undefined1 extraout_var [60];
  
  *pdfPos = 0.0;
  fVar7 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar5 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                   [1])),ZEXT416((uint)fVar7),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                   [1])),ZEXT416((uint)fVar7),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  fVar7 = auVar3._0_4_;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar10,auVar10);
  auVar3 = vfmadd231ss_fma(auVar3,auVar11,auVar11);
  if (auVar3._0_4_ < 0.0) {
    fVar4 = sqrtf(auVar3._0_4_);
    auVar11 = ZEXT416(auVar11._0_4_);
    auVar10 = ZEXT416(auVar10._0_4_);
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    fVar4 = auVar3._0_4_;
  }
  auVar9._0_4_ = auVar11._0_4_ / fVar4;
  auVar9._4_12_ = auVar11._4_12_;
  auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
  uVar1 = vcmpss_avx512f(auVar9,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar5 = acosf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar3._0_4_));
  auVar8._0_4_ = atan2f(fVar7 / fVar4,auVar10._0_4_ / fVar4);
  auVar8._4_60_ = extraout_var;
  uVar1 = vcmpss_avx512f(auVar8._0_16_,ZEXT416(0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_18.super_Tuple2<pbrt::Point2,_float>.x =
       (float)((uint)bVar2 * (int)(auVar8._0_4_ + 6.2831855) + (uint)!bVar2 * (int)auVar8._0_4_);
  local_18.super_Tuple2<pbrt::Point2,_float>.y = fVar5;
  FVar6 = PiecewiseConstant2D::PDF(&this->distrib,&local_18);
  fVar7 = sinf(fVar5);
  *pdfDir = FVar6 / fVar7;
  return;
}

Assistant:

void GoniometricLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    *pdfPos = 0.f;

    Vector3f wl = Normalize(renderFromLight.ApplyInverse(ray.d));
    Float theta = SphericalTheta(wl), phi = SphericalPhi(wl);
    *pdfDir = distrib.PDF(Point2f(phi, theta)) / std::sin(theta);
}